

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O0

int __thiscall
GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>::Compare
          (MP<8UL,_GF2::MOGrevlex<8UL>_> *this,MP<8UL,_GF2::MOGrevlex<8UL>_> *polyRight)

{
  bool bVar1;
  const_iterator this_00;
  const_iterator m1;
  int cmp;
  const_iterator iterRight;
  const_iterator iter;
  list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_> *in_stack_ffffffffffffff88;
  bool local_59;
  _Self local_50;
  _Self local_48;
  int local_3c;
  const_iterator in_stack_ffffffffffffffc8;
  _Self local_20 [3];
  int local_4;
  
  local_20[0]._M_node =
       (_List_node_base *)
       std::__cxx11::list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>::begin
                 (in_stack_ffffffffffffff88);
  this_00 = std::__cxx11::list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>::begin
                      (in_stack_ffffffffffffff88);
  while( true ) {
    m1 = std::__cxx11::list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>::end
                   (in_stack_ffffffffffffff88);
    bVar1 = std::operator!=(local_20,(_Self *)&stack0xffffffffffffffd0);
    local_59 = false;
    if (bVar1) {
      in_stack_ffffffffffffffc8 =
           std::__cxx11::list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>::end
                     (in_stack_ffffffffffffff88);
      local_59 = std::operator!=((_Self *)&stack0xffffffffffffffd8,(_Self *)&stack0xffffffffffffffc8
                                );
    }
    if (local_59 == false) break;
    std::_List_const_iterator<GF2::MM<8UL>_>::operator*
              ((_List_const_iterator<GF2::MM<8UL>_> *)0x1cc8f2);
    std::_List_const_iterator<GF2::MM<8UL>_>::operator*
              ((_List_const_iterator<GF2::MM<8UL>_> *)0x1cc901);
    local_3c = MOGrevlex<8UL>::Compare
                         ((MOGrevlex<8UL> *)this_00._M_node,(MM<8UL> *)m1._M_node,
                          (MM<8UL> *)in_stack_ffffffffffffffc8._M_node);
    if (local_3c != 0) {
      return local_3c;
    }
    std::_List_const_iterator<GF2::MM<8UL>_>::operator++(local_20);
    std::_List_const_iterator<GF2::MM<8UL>_>::operator++
              ((_List_const_iterator<GF2::MM<8UL>_> *)&stack0xffffffffffffffd8);
  }
  local_48._M_node =
       (_List_node_base *)
       std::__cxx11::list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>::end
                 (in_stack_ffffffffffffff88);
  bVar1 = std::operator==(local_20,&local_48);
  if (bVar1) {
    local_50._M_node =
         (_List_node_base *)
         std::__cxx11::list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>::end
                   (in_stack_ffffffffffffff88);
    bVar1 = std::operator==((_Self *)&stack0xffffffffffffffd8,&local_50);
    local_4 = -1;
    if (bVar1) {
      local_4 = 0;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int Compare(const MP& polyRight) const
	{
		assert(IsConsistent(polyRight));
		// цикл по мономам
		const_iterator iter = begin(), iterRight = polyRight.begin();
		for (; iter != end() && iterRight != polyRight.end(); ++iter, ++iterRight)
			if (int cmp = _order.Compare(*iter, *iterRight))
				return cmp;
		// проверка хвостов
		if (iter == end()) 
			return iterRight == polyRight.end() ? 0 : -1;
        return 1;
	}